

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O3

RK_S32 mpp_hevc_decode_short_term_rps
                 (HEVCContext *s,ShortTermRPS *rps,HEVCSPS *sps,RK_S32 is_slice_header)

{
  ShortTermRPS *pSVar1;
  RK_U8 RVar2;
  RK_S32 RVar3;
  BitReadCtx_t *bitctx;
  bool bVar4;
  MPP_RET MVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  RK_S32 _out;
  RK_U32 local_44;
  ulong local_40;
  int local_38;
  uint local_34;
  
  bitctx = &s->HEVClc->gb;
  pSVar1 = sps->st_rps;
  if ((pSVar1 != rps) && (sps->nb_st_rps != 0)) {
    MVar5 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_44);
    bitctx->ret = MVar5;
    if (MVar5 != MPP_OK) {
      return -0x3ec;
    }
    if ((RK_U8)local_44 != '\0') {
      if (is_slice_header == 0) {
        uVar7 = ((long)rps - (long)pSVar1 >> 2) * -0x7d05f417d05f417d - 1;
      }
      else {
        MVar5 = mpp_read_ue(bitctx,&local_44);
        bitctx->ret = MVar5;
        if (MVar5 != MPP_OK) {
          return -0x3ec;
        }
        uVar7 = (ulong)(sps->nb_st_rps - (local_44 + 1));
        if (sps->nb_st_rps < local_44 + 1) {
          _mpp_log_l(2,"H265PARSER_PS","Invalid value of delta_idx in slice header RPS: %d > %d.\n",
                     (char *)0x0);
          return -0x3ec;
        }
      }
      MVar5 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_44);
      bitctx->ret = MVar5;
      if (MVar5 != MPP_OK) {
        return -0x3ec;
      }
      local_40 = CONCAT44(local_40._4_4_,local_44);
      MVar5 = mpp_read_ue(bitctx,&local_44);
      bitctx->ret = MVar5;
      if (MVar5 != MPP_OK) {
        return -0x3ec;
      }
      if (pSVar1[uVar7].num_delta_pocs < 0) {
        rps->num_negative_pics = 0;
        rps->num_delta_pocs = 0;
        return 0;
      }
      local_38 = (local_44 + 1) * (((uint)local_40 & 0xff) * -2 + 1);
      local_40 = 0;
      uVar9 = 0;
      lVar11 = 0;
      do {
        MVar5 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_44);
        bitctx->ret = MVar5;
        if (MVar5 != MPP_OK) {
          return -0x3ec;
        }
        rps->used[(int)uVar9] = (RK_U8)local_44;
        local_34 = uVar9;
        if (local_44 == 0) {
          MVar5 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_44);
          bitctx->ret = MVar5;
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          uVar13 = local_34;
          if ((RK_U8)local_44 != '\0') goto LAB_001a0142;
        }
        else {
LAB_001a0142:
          iVar6 = local_38;
          if (lVar11 < pSVar1[uVar7].num_delta_pocs) {
            iVar6 = pSVar1[uVar7].delta_poc[lVar11] + local_38;
          }
          rps->delta_poc[(int)uVar9] = iVar6;
          local_40 = (ulong)(uint)((int)local_40 - (iVar6 >> 0x1f));
          uVar13 = uVar9 + 1;
        }
        uVar9 = uVar13;
        bVar4 = pSVar1[uVar7].num_delta_pocs <= lVar11;
        lVar11 = lVar11 + 1;
        if (bVar4) {
          rps->num_delta_pocs = uVar9;
          uVar13 = (uint)local_40;
          rps->num_negative_pics = uVar13;
          if (1 < (int)uVar9) {
            uVar7 = 1;
            uVar8 = 0;
            do {
              iVar6 = rps->delta_poc[uVar7];
              RVar2 = rps->used[uVar7];
              uVar10 = uVar8;
              do {
                uVar12 = uVar10 & 0xffffffff;
                if (iVar6 < rps->delta_poc[uVar12]) {
                  rps->delta_poc[uVar10 + 1] = rps->delta_poc[uVar12];
                  rps->used[uVar10 + 1] = rps->used[uVar12];
                  rps->delta_poc[uVar12] = iVar6;
                  rps->used[uVar12] = RVar2;
                }
                lVar11 = uVar10 + 1;
                uVar10 = uVar10 - 1;
              } while (1 < lVar11);
              uVar7 = uVar7 + 1;
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar9);
          }
          if (1 < uVar13) {
            if (1 < rps->num_negative_pics) {
              uVar7 = 0;
              do {
                uVar13 = uVar13 - 1;
                RVar3 = rps->delta_poc[uVar7];
                RVar2 = rps->used[uVar7];
                rps->delta_poc[uVar7] = rps->delta_poc[(int)uVar13];
                rps->used[uVar7] = rps->used[(int)uVar13];
                rps->delta_poc[(int)uVar13] = RVar3;
                rps->used[(int)uVar13] = RVar2;
                uVar7 = uVar7 + 1;
              } while (uVar7 < rps->num_negative_pics >> 1);
              return 0;
            }
            return 0;
          }
          return 0;
        }
      } while( true );
    }
  }
  MVar5 = mpp_read_ue(bitctx,&local_44);
  bitctx->ret = MVar5;
  if (MVar5 == MPP_OK) {
    rps->num_negative_pics = local_44;
    MVar5 = mpp_read_ue(bitctx,&local_44);
    bitctx->ret = MVar5;
    if (MVar5 == MPP_OK) {
      uVar9 = rps->num_negative_pics;
      if (local_44 < 0x10 && uVar9 < 0x10) {
        rps->num_delta_pocs = uVar9 + local_44;
        if (uVar9 + local_44 == 0) {
          return 0;
        }
        local_40 = CONCAT44(local_40._4_4_,local_44);
        if (uVar9 != 0) {
          uVar7 = 0;
          iVar6 = 0;
          do {
            MVar5 = mpp_read_ue(bitctx,&local_44);
            bitctx->ret = MVar5;
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            iVar6 = iVar6 + ~local_44;
            rps->delta_poc[uVar7] = iVar6;
            MVar5 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_44);
            bitctx->ret = MVar5;
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            rps->used[uVar7] = (RK_U8)local_44;
            uVar7 = uVar7 + 1;
          } while (uVar7 < rps->num_negative_pics);
        }
        iVar6 = (uint)local_40;
        if ((uint)local_40 == 0) {
          return 0;
        }
        iVar15 = 0;
        iVar14 = 0;
        while( true ) {
          MVar5 = mpp_read_ue(bitctx,&local_44);
          bitctx->ret = MVar5;
          if (MVar5 != MPP_OK) break;
          iVar15 = iVar15 + local_44 + 1;
          rps->delta_poc[rps->num_negative_pics + iVar14] = iVar15;
          MVar5 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_44);
          bitctx->ret = MVar5;
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          rps->used[rps->num_negative_pics + iVar14] = (RK_U8)local_44;
          iVar14 = iVar14 + 1;
          if (iVar6 == iVar14) {
            return 0;
          }
        }
      }
      else {
        _mpp_log_l(2,"H265PARSER_PS","Too many refs in a short term RPS.\n",(char *)0x0);
      }
    }
  }
  return -0x3ec;
}

Assistant:

int mpp_hevc_decode_short_term_rps(HEVCContext *s, ShortTermRPS *rps,
                                   const HEVCSPS *sps, RK_S32 is_slice_header)
{
    HEVCLocalContext *lc = s->HEVClc;
    RK_U8 rps_predict = 0;
    RK_S32 delta_poc;
    RK_S32 k0 = 0;
    RK_S32 k  = 0;
    RK_S32 i;

    BitReadCtx_t *gb = &lc->gb;

    if (rps != sps->st_rps && sps->nb_st_rps)
        READ_ONEBIT(gb, &rps_predict);

    if (rps_predict) {
        const ShortTermRPS *rps_ridx;
        RK_S32 delta_rps, abs_delta_rps;
        RK_U8 use_delta_flag = 0;
        RK_U8 delta_rps_sign;

        if (is_slice_header) {
            RK_U32 delta_idx = 0;
            READ_UE(gb, &delta_idx);
            delta_idx = delta_idx + 1;
            if (delta_idx > sps->nb_st_rps) {
                mpp_err(
                    "Invalid value of delta_idx in slice header RPS: %d > %d.\n",
                    delta_idx, sps->nb_st_rps);
                return  MPP_ERR_STREAM;
            }
            rps_ridx = &sps->st_rps[sps->nb_st_rps - delta_idx];
        } else
            rps_ridx = &sps->st_rps[rps - sps->st_rps - 1];

        READ_BITS(gb, 1, &delta_rps_sign);

        READ_UE(gb, &abs_delta_rps);

        abs_delta_rps = abs_delta_rps + 1;

        delta_rps      = (1 - (delta_rps_sign << 1)) * abs_delta_rps;
        for (i = 0; i <= rps_ridx->num_delta_pocs; i++) {
            RK_S32 used = 0;
            READ_ONEBIT(gb, &used);

            rps->used[k] = used;

            if (!used)
                READ_ONEBIT(gb, &use_delta_flag);

            if (used || use_delta_flag) {
                if (i < rps_ridx->num_delta_pocs)
                    delta_poc = delta_rps + rps_ridx->delta_poc[i];
                else
                    delta_poc = delta_rps;
                rps->delta_poc[k] = delta_poc;
                if (delta_poc < 0)
                    k0++;
                k++;
            }
        }

        rps->num_delta_pocs    = k;
        rps->num_negative_pics = k0;
        // sort in increasing order (smallest first)
        if (rps->num_delta_pocs != 0) {
            RK_S32 used, tmp;
            for (i = 1; i < rps->num_delta_pocs; i++) {
                delta_poc = rps->delta_poc[i];
                used      = rps->used[i];
                for (k = i - 1; k >= 0; k--) {
                    tmp = rps->delta_poc[k];
                    if (delta_poc < tmp) {
                        rps->delta_poc[k + 1] = tmp;
                        rps->used[k + 1]      = rps->used[k];
                        rps->delta_poc[k]     = delta_poc;
                        rps->used[k]          = used;
                    }
                }
            }
        }
        if ((rps->num_negative_pics >> 1) != 0) {
            RK_S32 used;
            k = rps->num_negative_pics - 1;
            // flip the negative values to largest first
            for (i = 0; (RK_U32)i < rps->num_negative_pics >> 1; i++) {
                delta_poc         = rps->delta_poc[i];
                used              = rps->used[i];
                rps->delta_poc[i] = rps->delta_poc[k];
                rps->used[i]      = rps->used[k];
                rps->delta_poc[k] = delta_poc;
                rps->used[k]      = used;
                k--;
            }
        }
    } else {
        RK_U32 prev, nb_positive_pics;

        READ_UE(gb, &rps->num_negative_pics);

        READ_UE(gb, &nb_positive_pics);

        if (rps->num_negative_pics >= MAX_REFS ||
            nb_positive_pics >= MAX_REFS) {
            mpp_err( "Too many refs in a short term RPS.\n");
            return  MPP_ERR_STREAM;
        }

        rps->num_delta_pocs = rps->num_negative_pics + nb_positive_pics;
        if (rps->num_delta_pocs) {
            prev = 0;
            for (i = 0; (RK_U32)i < rps->num_negative_pics; i++) {
                READ_UE(gb, &delta_poc);
                delta_poc += 1;
                prev -= delta_poc;
                rps->delta_poc[i] = prev;
                READ_ONEBIT(gb, &rps->used[i]);
            }
            prev = 0;
            for (i = 0; (RK_U32)i < nb_positive_pics; i++) {
                READ_UE(gb, &delta_poc);
                delta_poc = delta_poc + 1;
                prev += delta_poc;
                rps->delta_poc[rps->num_negative_pics + i] = prev;
                READ_ONEBIT(gb, &rps->used[rps->num_negative_pics + i]);
            }
        }
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}